

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O2

value * helics::fileops::loadTomlStr(value *__return_storage_ptr__,string *tomlString)

{
  string fname;
  undefined8 in_stack_fffffffffffffe30;
  spec in_stack_fffffffffffffe38;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  istringstream tstring;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&tstring,(string *)tomlString,_S_in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe38,"unknown file",
             (allocator<char> *)&stack0xfffffffffffffe37);
  toml::spec::default_version();
  fname._M_string_length = uStack_1a0;
  fname._M_dataplus._M_p = (pointer)local_1a8;
  fname.field_2._M_allocated_capacity = local_198;
  fname.field_2._8_8_ = in_stack_fffffffffffffe30;
  toml::parse<toml::type_config>
            (__return_storage_ptr__,(istream *)&tstring,fname,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
  std::__cxx11::istringstream::~istringstream((istringstream *)&tstring);
  return __return_storage_ptr__;
}

Assistant:

toml::value loadTomlStr(const std::string& tomlString)
{
    try {
        std::istringstream tstring(tomlString);
        toml::value doc = toml::parse(tstring);
        return doc;
    }
    catch (const toml::exception& se) {
        throw(std::invalid_argument(se.what()));
    }
}